

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,double,double,double>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,double *args,
          double *args_1,double *args_2)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  memory_buf_t buf;
  log_msg log_msg;
  buffer<char> local_1b8;
  char local_198 [256];
  undefined1 local_98 [32];
  double local_78;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_1b8.ptr_ = local_198;
    local_1b8.size_ = 0;
    local_1b8._vptr_buffer = (_func_int **)&PTR_grow_00329538;
    local_1b8.capacity_ = 0xfa;
    local_98._0_8_ = *args;
    local_98._16_8_ = *args_1;
    local_78 = *args_2;
    args_00.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_98;
    args_00.desc_ = 0xaaa;
    ::fmt::v7::detail::vformat_to<char>(&local_1b8,*fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_1b8.size_;
    msg.data_ = local_1b8.ptr_;
    details::log_msg::log_msg((log_msg *)local_98,loc,a_logger_name,lvl,msg);
    log_it_(this,(log_msg *)local_98,iVar1 <= (int)lvl,traceback_enabled);
    if (local_1b8.ptr_ != local_198) {
      operator_delete(local_1b8.ptr_,local_1b8.capacity_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }